

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

int __thiscall embree::XMLWriter::open(XMLWriter *this,char *__file,int __oflag,...)

{
  int iVar1;
  ostream *poVar2;
  undefined8 *in_RCX;
  ulong uVar3;
  
  if (this->ident != 0) {
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->ident);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10,"<",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x10,*(char **)__file,*(long *)(__file + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," id=\"",5);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" name=\"",8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)*in_RCX,in_RCX[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\">",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  iVar1 = std::ostream::flush();
  this->ident = this->ident + 2;
  return iVar1;
}

Assistant:

void XMLWriter::open(std::string str, size_t id, std::string name)
  {
    tab(); xml << "<" << str << " id=\"" << id << "\" name=\"" << name << "\">" << std::endl;
    ident+=2;
  }